

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O3

bool __thiscall
spirv_cross::CompilerMSL::is_out_of_bounds_tessellation_level(CompilerMSL *this,uint32_t id_lhs)

{
  uint32_t uVar1;
  Variant *pVVar2;
  bool bVar3;
  uint32_t uVar4;
  SPIRExpression *pSVar5;
  ulong uVar6;
  SPIRConstant *pSVar7;
  
  uVar6 = (ulong)id_lhs;
  bVar3 = Compiler::is_tessellating_triangles((Compiler *)this);
  if ((((bVar3) &&
       (uVar6 < (this->super_CompilerGLSL).super_Compiler.ir.ids.
                super_VectorView<spirv_cross::Variant>.buffer_size)) &&
      (pVVar2 = (this->super_CompilerGLSL).super_Compiler.ir.ids.
                super_VectorView<spirv_cross::Variant>.ptr, pVVar2[uVar6].type == TypeExpression))
     && (((pSVar5 = Variant::get<spirv_cross::SPIRExpression>(pVVar2 + uVar6),
          pSVar5->access_chain == true &&
          (uVar4 = Compiler::get_decoration
                             ((Compiler *)this,(ID)(pSVar5->loaded_from).id,DecorationBuiltIn),
          0xfffffffd < uVar4 - 0xd)) &&
         ((uVar6 = (ulong)(pSVar5->implied_read_expressions).
                          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr[1].id,
          uVar6 < (this->super_CompilerGLSL).super_Compiler.ir.ids.
                  super_VectorView<spirv_cross::Variant>.buffer_size &&
          (pVVar2 = (this->super_CompilerGLSL).super_Compiler.ir.ids.
                    super_VectorView<spirv_cross::Variant>.ptr, pVVar2[uVar6].type == TypeConstant))
         )))) {
    pSVar7 = Variant::get<spirv_cross::SPIRConstant>(pVVar2 + uVar6);
    uVar1 = (pSVar7->m).c[0].r[0].u32;
    if (uVar4 == 0xc) {
      bVar3 = uVar1 == 1;
    }
    else {
      bVar3 = uVar1 == 3;
    }
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool CompilerMSL::is_out_of_bounds_tessellation_level(uint32_t id_lhs)
{
	if (!is_tessellating_triangles())
		return false;

	// In SPIR-V, TessLevelInner always has two elements and TessLevelOuter always has
	// four. This is true even if we are tessellating triangles. This allows clients
	// to use a single tessellation control shader with multiple tessellation evaluation
	// shaders.
	// In Metal, however, only the first element of TessLevelInner and the first three
	// of TessLevelOuter are accessible. This stems from how in Metal, the tessellation
	// levels must be stored to a dedicated buffer in a particular format that depends
	// on the patch type. Therefore, in Triangles mode, any store to the second
	// inner level or the fourth outer level must be dropped.
	const auto *e = maybe_get<SPIRExpression>(id_lhs);
	if (!e || !e->access_chain)
		return false;
	BuiltIn builtin = BuiltIn(get_decoration(e->loaded_from, DecorationBuiltIn));
	if (builtin != BuiltInTessLevelInner && builtin != BuiltInTessLevelOuter)
		return false;
	auto *c = maybe_get<SPIRConstant>(e->implied_read_expressions[1]);
	if (!c)
		return false;
	return (builtin == BuiltInTessLevelInner && c->scalar() == 1) ||
	       (builtin == BuiltInTessLevelOuter && c->scalar() == 3);
}